

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

void htmlParseReference(htmlParserCtxtPtr ctxt)

{
  charactersSAXFunc p_Var1;
  void *pvVar2;
  uint uVar3;
  int iVar4;
  int local_40;
  int local_3c;
  int i_1;
  int bits_1;
  uint c_1;
  int i;
  int bits;
  uint c;
  xmlChar *name;
  htmlEntityDesc *phStack_18;
  xmlChar out [6];
  htmlEntityDesc *ent;
  htmlParserCtxtPtr ctxt_local;
  
  if (*ctxt->input->cur == '&') {
    if (ctxt->input->cur[1] == '#') {
      uVar3 = htmlParseCharRef(ctxt);
      if (uVar3 != 0) {
        if (uVar3 < 0x80) {
          name._2_1_ = (byte)uVar3;
          c_1 = 0xfffffffa;
        }
        else if (uVar3 < 0x800) {
          name._2_1_ = (byte)(uVar3 >> 6) & 0x1f | 0xc0;
          c_1 = 0;
        }
        else if (uVar3 < 0x10000) {
          name._2_1_ = (byte)(uVar3 >> 0xc) & 0xf | 0xe0;
          c_1 = 6;
        }
        else {
          name._2_1_ = (byte)(uVar3 >> 0x12) & 7 | 0xf0;
          c_1 = 0xc;
        }
        bits_1 = 1;
        for (; -1 < (int)c_1; c_1 = c_1 - 6) {
          *(byte *)((long)&name + (long)bits_1 + 2) =
               (byte)(uVar3 >> ((byte)c_1 & 0x1f)) & 0x3f | 0x80;
          bits_1 = bits_1 + 1;
        }
        *(undefined1 *)((long)&name + (long)bits_1 + 2) = 0;
        htmlCheckParagraph(ctxt);
        if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
           (ctxt->sax->characters != (charactersSAXFunc)0x0)) {
          (*ctxt->sax->characters)(ctxt->userData,(xmlChar *)((long)&name + 2),bits_1);
        }
      }
    }
    else {
      phStack_18 = htmlParseEntityRef(ctxt,(xmlChar **)&bits);
      if (_bits == (xmlChar *)0x0) {
        htmlCheckParagraph(ctxt);
        if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
           (ctxt->sax->characters != (charactersSAXFunc)0x0)) {
          (*ctxt->sax->characters)(ctxt->userData,(xmlChar *)"&",1);
        }
      }
      else if ((phStack_18 == (htmlEntityDesc *)0x0) || (phStack_18->value == 0)) {
        htmlCheckParagraph(ctxt);
        if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
           (ctxt->sax->characters != (charactersSAXFunc)0x0)) {
          (*ctxt->sax->characters)(ctxt->userData,(xmlChar *)"&",1);
          p_Var1 = ctxt->sax->characters;
          pvVar2 = ctxt->userData;
          iVar4 = xmlStrlen(_bits);
          (*p_Var1)(pvVar2,_bits,iVar4);
        }
      }
      else {
        uVar3 = phStack_18->value;
        if (uVar3 < 0x80) {
          name._2_1_ = (byte)uVar3;
          local_3c = -6;
        }
        else if (uVar3 < 0x800) {
          name._2_1_ = (byte)(uVar3 >> 6) & 0x1f | 0xc0;
          local_3c = 0;
        }
        else if (uVar3 < 0x10000) {
          name._2_1_ = (byte)(uVar3 >> 0xc) & 0xf | 0xe0;
          local_3c = 6;
        }
        else {
          name._2_1_ = (byte)(uVar3 >> 0x12) & 7 | 0xf0;
          local_3c = 0xc;
        }
        local_40 = 1;
        for (; -1 < local_3c; local_3c = local_3c + -6) {
          *(byte *)((long)&name + (long)local_40 + 2) =
               (byte)(uVar3 >> ((byte)local_3c & 0x1f)) & 0x3f | 0x80;
          local_40 = local_40 + 1;
        }
        *(undefined1 *)((long)&name + (long)local_40 + 2) = 0;
        htmlCheckParagraph(ctxt);
        if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
           (ctxt->sax->characters != (charactersSAXFunc)0x0)) {
          (*ctxt->sax->characters)(ctxt->userData,(xmlChar *)((long)&name + 2),local_40);
        }
      }
    }
  }
  return;
}

Assistant:

static void
htmlParseReference(htmlParserCtxtPtr ctxt) {
    const htmlEntityDesc * ent;
    xmlChar out[6];
    const xmlChar *name;
    if (CUR != '&') return;

    if (NXT(1) == '#') {
	unsigned int c;
	int bits, i = 0;

	c = htmlParseCharRef(ctxt);
	if (c == 0)
	    return;

        if      (c <    0x80) { out[i++]= c;                bits= -6; }
        else if (c <   0x800) { out[i++]=((c >>  6) & 0x1F) | 0xC0;  bits=  0; }
        else if (c < 0x10000) { out[i++]=((c >> 12) & 0x0F) | 0xE0;  bits=  6; }
        else                  { out[i++]=((c >> 18) & 0x07) | 0xF0;  bits= 12; }

        for ( ; bits >= 0; bits-= 6) {
            out[i++]= ((c >> bits) & 0x3F) | 0x80;
        }
	out[i] = 0;

	htmlCheckParagraph(ctxt);
	if ((ctxt->sax != NULL) && (ctxt->sax->characters != NULL))
	    ctxt->sax->characters(ctxt->userData, out, i);
    } else {
	ent = htmlParseEntityRef(ctxt, &name);
	if (name == NULL) {
	    htmlCheckParagraph(ctxt);
	    if ((ctxt->sax != NULL) && (ctxt->sax->characters != NULL))
	        ctxt->sax->characters(ctxt->userData, BAD_CAST "&", 1);
	    return;
	}
	if ((ent == NULL) || !(ent->value > 0)) {
	    htmlCheckParagraph(ctxt);
	    if ((ctxt->sax != NULL) && (ctxt->sax->characters != NULL)) {
		ctxt->sax->characters(ctxt->userData, BAD_CAST "&", 1);
		ctxt->sax->characters(ctxt->userData, name, xmlStrlen(name));
		/* ctxt->sax->characters(ctxt->userData, BAD_CAST ";", 1); */
	    }
	} else {
	    unsigned int c;
	    int bits, i = 0;

	    c = ent->value;
	    if      (c <    0x80)
	            { out[i++]= c;                bits= -6; }
	    else if (c <   0x800)
	            { out[i++]=((c >>  6) & 0x1F) | 0xC0;  bits=  0; }
	    else if (c < 0x10000)
	            { out[i++]=((c >> 12) & 0x0F) | 0xE0;  bits=  6; }
	    else
	            { out[i++]=((c >> 18) & 0x07) | 0xF0;  bits= 12; }

	    for ( ; bits >= 0; bits-= 6) {
		out[i++]= ((c >> bits) & 0x3F) | 0x80;
	    }
	    out[i] = 0;

	    htmlCheckParagraph(ctxt);
	    if ((ctxt->sax != NULL) && (ctxt->sax->characters != NULL))
		ctxt->sax->characters(ctxt->userData, out, i);
	}
    }
}